

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_inc(BtorSimBitVector *bv)

{
  BtorSimBitVector *b;
  BtorSimBitVector *pBVar1;
  
  b = btorsim_bv_one(bv->width);
  pBVar1 = btorsim_bv_add(bv,b);
  free(b);
  return pBVar1;
}

Assistant:

BtorSimBitVector *
btorsim_bv_inc (const BtorSimBitVector *bv)
{
  assert (bv);

  BtorSimBitVector *res, *one;

  one = btorsim_bv_one (bv->width);
  res = btorsim_bv_add (bv, one);
  free (one);
  return res;
}